

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# File.cpp
# Opt level: O2

bool __thiscall File::readString(File *this,string *value)

{
  bool bVar1;
  size_t sVar2;
  unsigned_long len;
  
  if (this->valid == true) {
    bVar1 = readULong(this,&len);
    if (bVar1) {
      std::__cxx11::string::resize((ulong)value);
      sVar2 = fread((value->_M_dataplus)._M_p,1,len,(FILE *)this->stream);
      bVar1 = sVar2 == len;
    }
    else {
      bVar1 = false;
    }
    return bVar1;
  }
  return false;
}

Assistant:

bool File::readString(std::string& value)
{
	if (!valid) return false;

	// Retrieve the length to read from the file
	unsigned long len;

	if (!readULong(len))
	{
		return false;
	}

	// Read the string from the file
	value.resize(len);

	if (fread(&value[0], 1, len, stream) != len)
	{
		return false;
	}

	return true;
}